

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_dma_heap.c
# Opt level: O0

MPP_RET try_flip_flag(RK_U32 orig,RK_U32 flag)

{
  RK_S32 RVar1;
  MPP_RET MVar2;
  ulong uVar3;
  uint local_24;
  RK_U32 used;
  DmaHeapInfo *src;
  DmaHeapInfo *dst;
  RK_U32 flag_local;
  RK_U32 orig_local;
  
  if ((orig & flag) == 0) {
    local_24 = orig | flag;
  }
  else {
    local_24 = orig & (flag ^ 0xffffffff);
  }
  uVar3 = (ulong)local_24;
  if (0 < heap_infos[uVar3].fd) {
    RVar1 = mpp_dup(heap_infos[uVar3].fd);
    heap_infos[orig].fd = RVar1;
    heap_infos[orig].flags = heap_infos[uVar3].flags;
    if ((dma_heap_debug & 8) != 0) {
      _mpp_log_l(4,"mpp_dma_heap","dma-heap type %x %s remap to %x %s\n",(char *)0x0,(ulong)orig,
                 heap_infos[orig].name,local_24,heap_infos[uVar3].name);
    }
  }
  MVar2 = MPP_NOK;
  if (0 < heap_infos[orig].fd) {
    MVar2 = MPP_OK;
  }
  return MVar2;
}

Assistant:

static MPP_RET try_flip_flag(RK_U32 orig, RK_U32 flag)
{
    DmaHeapInfo *dst = &heap_infos[orig];
    DmaHeapInfo *src;
    RK_U32 used;

    if (orig & flag)
        used = (RK_U32)(orig & (~flag));
    else
        used = (RK_U32)(orig | flag);

    src = &heap_infos[used];
    if (src->fd > 0) {
        /* found valid heap use it */
        dst->fd = mpp_dup(src->fd);
        dst->flags = src->flags;

        dma_heap_dbg_chk("dma-heap type %x %s remap to %x %s\n",
                         orig, dst->name, used, src->name);
    }

    return dst->fd > 0 ? MPP_OK : MPP_NOK;
}